

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O3

vector<chatra::NativeMethod,_std::allocator<chatra::NativeMethod>_> * __thiscall
chatra::filterNativeMethods
          (vector<chatra::NativeMethod,_std::allocator<chatra::NativeMethod>_>
           *__return_storage_ptr__,chatra *this,StringTable *sTable,
          vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
          *handlers,StringId sidClass)

{
  StringId in_EAX;
  StringId extraout_EAX;
  undefined4 in_register_00000004;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  StringId local_40;
  StringId local_3c [3];
  
  (__return_storage_ptr__->
  super__Vector_base<chatra::NativeMethod,_std::allocator<chatra::NativeMethod>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<chatra::NativeMethod,_std::allocator<chatra::NativeMethod>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<chatra::NativeMethod,_std::allocator<chatra::NativeMethod>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (sTable != (StringTable *)handlers) {
    do {
      in_EAX = getStringIdOrThrow((StringTable *)this,(string *)&sTable->strToId);
      in_register_00000004 = extraout_var;
      if (in_EAX == sidClass) {
        local_40 = getStringIdOrThrow((StringTable *)this,
                                      (string *)&(sTable->strToId)._M_h._M_rehash_policy);
        local_3c[0] = getStringIdOrThrow((StringTable *)this,
                                         (string *)
                                         &(sTable->idToStr).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish);
        std::vector<chatra::NativeMethod,std::allocator<chatra::NativeMethod>>::
        emplace_back<chatra::StringId,chatra::StringId,void(&)(void(*)(chatra::NativeCallContext&),chatra::Thread&,chatra::ObjectBase*,chatra::StringId,chatra::StringId,chatra::Tuple&,chatra::Reference),void(*const&)(chatra::NativeCallContext&)>
                  ((vector<chatra::NativeMethod,std::allocator<chatra::NativeMethod>> *)
                   __return_storage_ptr__,&local_40,local_3c,nativeCall,
                   (_func_void_NativeCallContext_ptr **)sTable);
        in_EAX = extraout_EAX;
        in_register_00000004 = extraout_var_00;
      }
      sTable = (StringTable *)&sTable[1].strToId._M_h._M_bucket_count;
    } while (sTable != (StringTable *)handlers);
  }
  return (vector<chatra::NativeMethod,_std::allocator<chatra::NativeMethod>_> *)
         CONCAT44(in_register_00000004,in_EAX);
}

Assistant:

static std::vector<NativeMethod> filterNativeMethods(
		const StringTable* sTable, const std::vector<NativeCallHandlerInfo>& handlers, StringId sidClass = StringId::Invalid) {

	std::vector<NativeMethod> ret;
	for (auto& e : handlers) {
		try {
			if (sidClass == getStringIdOrThrow(sTable, e.className)) {
				ret.emplace_back(getStringIdOrThrow(sTable, e.name), getStringIdOrThrow(sTable, e.subName),
						nativeCall, e.handler);
			}
		}
		catch (RuntimeException&) {
			// do nothing
		}
	}
	return ret;
}